

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intervals.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
wasm::IntervalProcessor::filterOverlaps
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<wasm::Interval,_std::allocator<wasm::Interval>_> *intervals)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  iterator __first;
  reference pvVar4;
  reference ppVar5;
  pair<wasm::Interval,_int> *intPair;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
  *__range1_1;
  value_type *former;
  pair<wasm::Interval,_int> *candidate;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_> *__range1
  ;
  vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_> kept;
  pair<wasm::Interval,_int> local_50;
  reference local_40;
  value_type *interval;
  undefined1 local_30 [4];
  Index i;
  vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
  intIntervals;
  vector<wasm::Interval,_std::allocator<wasm::Interval>_> *intervals_local;
  vector<int,_std::allocator<int>_> *result;
  
  intIntervals.
  super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)intervals;
  sVar2 = std::vector<wasm::Interval,_std::allocator<wasm::Interval>_>::size(intervals);
  if (sVar2 == 0) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  }
  else {
    std::vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>::
    vector((vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
            *)local_30);
    for (interval._4_4_ = 0; uVar3 = (ulong)interval._4_4_,
        sVar2 = std::vector<wasm::Interval,_std::allocator<wasm::Interval>_>::size
                          ((vector<wasm::Interval,_std::allocator<wasm::Interval>_> *)
                           intIntervals.
                           super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage), uVar3 < sVar2;
        interval._4_4_ = interval._4_4_ + 1) {
      local_40 = std::vector<wasm::Interval,_std::allocator<wasm::Interval>_>::operator[]
                           ((vector<wasm::Interval,_std::allocator<wasm::Interval>_> *)
                            intIntervals.
                            super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)interval._4_4_
                           );
      std::pair<wasm::Interval,_int>::pair<wasm::Interval_&,_unsigned_int_&,_true>
                (&local_50,local_40,(uint *)((long)&interval + 4));
      std::vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
      ::push_back((vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                   *)local_30,&local_50);
    }
    __first = std::
              vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
              ::begin((vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                       *)local_30);
    kept.
    super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                  ::end((vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                         *)local_30);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<wasm::Interval,int>*,std::vector<std::pair<wasm::Interval,int>,std::allocator<std::pair<wasm::Interval,int>>>>>
              ((__normal_iterator<std::pair<wasm::Interval,_int>_*,_std::vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::pair<wasm::Interval,_int>_*,_std::vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>_>
                )kept.
                 super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>::
    vector((vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
            *)&__range1);
    pvVar4 = std::
             vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
             ::operator[]((vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                           *)local_30,0);
    std::vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>::
    push_back((vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
               *)&__range1,pvVar4);
    __end1 = std::
             vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
             ::begin((vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                      *)local_30);
    candidate = (pair<wasm::Interval,_int> *)
                std::
                vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                ::end((vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                       *)local_30);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::pair<wasm::Interval,_int>_*,_std::vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>_>
                                       *)&candidate), bVar1) {
      ppVar5 = __gnu_cxx::
               __normal_iterator<std::pair<wasm::Interval,_int>_*,_std::vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>_>
               ::operator*(&__end1);
      pvVar4 = std::
               vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
               ::back((vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                       *)&__range1);
      if ((ppVar5->first).start < (pvVar4->first).end) {
        if (((pvVar4->first).weight == (ppVar5->first).weight) &&
           ((ppVar5->first).end < (pvVar4->first).end)) {
          std::pair<wasm::Interval,_int>::operator=(pvVar4,ppVar5);
        }
        else if ((pvVar4->first).weight < (ppVar5->first).weight) {
          std::pair<wasm::Interval,_int>::operator=(pvVar4,ppVar5);
        }
      }
      else {
        std::
        vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>::
        push_back((vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                   *)&__range1,ppVar5);
      }
      __gnu_cxx::
      __normal_iterator<std::pair<wasm::Interval,_int>_*,_std::vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>_>
      ::operator++(&__end1);
    }
    std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
    __end1_1 = std::
               vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
               ::begin((vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                        *)&__range1);
    intPair = (pair<wasm::Interval,_int> *)
              std::
              vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
              ::end((vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                     *)&__range1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<std::pair<wasm::Interval,_int>_*,_std::vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>_>
                               *)&intPair), bVar1) {
      ppVar5 = __gnu_cxx::
               __normal_iterator<std::pair<wasm::Interval,_int>_*,_std::vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>_>
               ::operator*(&__end1_1);
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&ppVar5->second);
      __gnu_cxx::
      __normal_iterator<std::pair<wasm::Interval,_int>_*,_std::vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>_>
      ::operator++(&__end1_1);
    }
    std::vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>::
    ~vector((vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
             *)&__range1);
    std::vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>::
    ~vector((vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
             *)local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int>
IntervalProcessor::filterOverlaps(std::vector<Interval>& intervals) {
  if (intervals.size() == 0) {
    return std::vector<int>();
  }

  std::vector<std::pair<Interval, int>> intIntervals;
  for (Index i = 0; i < intervals.size(); i++) {
    auto& interval = intervals[i];
    intIntervals.push_back({interval, i});
  }

  std::sort(intIntervals.begin(), intIntervals.end());

  std::vector<std::pair<Interval, int>> kept;
  kept.push_back(intIntervals[0]);
  for (auto& candidate : intIntervals) {
    auto& former = kept.back();
    if (former.first.end <= candidate.first.start) {
      kept.push_back(candidate);
      continue;
    }

    // When two intervals overlap with the same weight, prefer to keep the
    // interval that ends sooner under the presumption that it will overlap with
    // fewer subsequent intervals.
    if (former.first.weight == candidate.first.weight &&
        former.first.end > candidate.first.end) {
      former = candidate;
    } else if (former.first.weight < candidate.first.weight) {
      former = candidate;
    }
  }

  std::vector<int> result;
  for (auto& intPair : kept) {
    result.push_back(intPair.second);
  }

  return result;
}